

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

iterator __thiscall
cs::tree_type<cs::token_base_*>::reserve_right(tree_type<cs::token_base_*> *this,iterator it)

{
  tree_node *ptVar1;
  tree_node *ptVar2;
  error *this_00;
  string local_38;
  
  if (it.mData != (tree_node *)0x0) {
    ptVar1 = (it.mData)->root;
    ptVar2 = (it.mData)->right;
    (it.mData)->right = (tree_node *)0x0;
    ptVar2->root = ptVar1;
    if (ptVar1 != (tree_node *)0x0) {
      (&ptVar1->left)[ptVar1->left != it.mData] = ptVar2;
    }
    destroy(it.mData);
    if (this->mRoot == it.mData) {
      this->mRoot = ptVar2;
    }
    return (iterator)ptVar2;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000E","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool usable() const noexcept
			{
				return this->mData != nullptr;
			}